

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.cpp
# Opt level: O1

shared_ptr<helics::Core>
helics::CoreFactory::FindOrCreate(CoreType type,string_view coreName,string_view configureString)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  bool bVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  undefined4 in_register_0000003c;
  string_view name;
  string_view name_00;
  string_view name_01;
  shared_ptr<helics::Core> sVar6;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  
  name_00._M_len = (shared_ptr<helics::Core> *)CONCAT44(in_register_0000003c,type);
  name._M_str = coreName._M_str;
  name_00._M_str = name._M_str;
  sVar6 = findCore(name_00);
  _Var5 = sVar6.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (((name_00._M_len)->super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
    name._M_len = coreName._M_len & 0xffffffff;
    makeCore((CoreType)&local_48,name);
    p_Var3 = p_Stack_40;
    peVar2 = local_48;
    local_48 = (element_type *)0x0;
    p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var1 = ((name_00._M_len)->super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    ((name_00._M_len)->super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar2
    ;
    ((name_00._M_len)->super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
    _M_pi = p_Var3;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
    }
    peVar2 = ((name_00._M_len)->super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    (*peVar2->_vptr_Core[2])(peVar2,configureString._M_str);
    bVar4 = registerCore(name_00._M_len,(CoreType)coreName._M_len);
    _Var5._M_pi = extraout_RDX;
    if (!bVar4) {
      name_01._M_str = name._M_str;
      name_01._M_len = (size_t)&local_48;
      sVar6 = findCore(name_01);
      p_Var3 = p_Stack_40;
      peVar2 = local_48;
      _Var5 = sVar6.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      local_48 = (element_type *)0x0;
      p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var1 = ((name_00._M_len)->super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      ((name_00._M_len)->super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           peVar2;
      ((name_00._M_len)->super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
      _M_pi = p_Var3;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
        _Var5._M_pi = extraout_RDX_00;
      }
      if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
        _Var5._M_pi = extraout_RDX_01;
      }
    }
  }
  sVar6.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var5._M_pi
  ;
  sVar6.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)name_00._M_len;
  return (shared_ptr<helics::Core>)
         sVar6.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Core>
    FindOrCreate(CoreType type, std::string_view coreName, std::string_view configureString)
{
    std::shared_ptr<Core> core = findCore(coreName);
    if (core) {
        return core;
    }
    core = makeCore(type, coreName);
    core->configure(configureString);

    if (!registerCore(core, type)) {
        core = findCore(coreName);
        if (core) {
            return core;
        }
    }

    return core;
}